

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saxman.h
# Opt level: O0

void ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output,uint compressed_length)

{
  bool bVar1;
  uchar value;
  byte bVar2;
  byte bVar3;
  uint count_00;
  uint distance_00;
  difference_type dVar4;
  difference_type dVar5;
  uint distance;
  uint output_position;
  uint count;
  uint dictionary_index;
  uint second_byte;
  uint first_byte;
  BitField<decltype(input)> descriptor_bits;
  pos_type output_start_position;
  pos_type input_start_position;
  uint compressed_length_local;
  DecompressorOutput<std::basic_ofstream<char>_&> *output_local;
  DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input_local;
  
  join_0x00000010_0x00000000_ =
       DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
       ::Tell(&input->
               super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             );
  join_0x00000010_0x00000000_ =
       OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
       ::Tell(&output->
               super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
             );
  BitField::
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  ::Reader((Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
            *)&second_byte,input);
  while (dVar4 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                 ::Distance(&input->
                             super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            ,(pos_type *)&output_start_position._M_state),
        dVar4 < (long)(ulong)compressed_length) {
    bVar1 = BitField::
            Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
            ::Pop((Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
                   *)&second_byte);
    if (bVar1) {
      value = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      *)input);
      OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
      ::Write((OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
               *)output,value);
    }
    else {
      bVar2 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      *)input);
      bVar3 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      *)input);
      count_00 = (bVar3 & 0xf) + 3;
      dVar5 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
              ::Distance(&output->
                          super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
                         ,(pos_type *)&descriptor_bits.bits_remaining);
      distance_00 = (uint)dVar5 - (((uint)bVar2 | (bVar3 & 0xf0) << 4) + 0x12) & 0xfff;
      if ((uint)dVar5 < distance_00) {
        OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
        ::Fill((OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
                *)output,'\0',count_00);
      }
      else {
        DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>::
        Copy(output,distance_00,count_00);
      }
    }
  }
  return;
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output, const unsigned int compressed_length)
			{
				const auto input_start_position = input.Tell();
				const auto output_start_position = output.Tell();

				BitField<decltype(input)> descriptor_bits(input);

				while (input.Distance(input_start_position) < compressed_length)
				{
					if (descriptor_bits.Pop())
					{
						// Uncompressed.
						output.Write(input.Read());
					}
					else
					{
						// Dictionary match.
						const unsigned int first_byte = input.Read();
						const unsigned int second_byte = input.Read();
						const unsigned int dictionary_index = (first_byte | ((second_byte << 4) & 0xF00)) + (0xF + 3);
						const unsigned int count = (second_byte & 0xF) + 3;
						const unsigned int output_position = output.Distance(output_start_position);
						const unsigned int distance = (output_position - dictionary_index) % 0x1000;

						if (distance > output_position)
						{
							// Zero-fill.
							output.Fill(0, count);
						}
						else
						{
							// Copy.
							output.Copy(distance, count);
						}
					}
				}
			}